

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kfpu.c
# Opt level: O1

void store_pack_float80(uint32 ea,int k,floatx80 fpr)

{
  byte bVar1;
  uint uVar2;
  uint32 uVar3;
  float64 fVar4;
  int iVar5;
  ulong uVar6;
  byte *pbVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  byte *pbVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  byte *pbVar17;
  uint value;
  uint value_00;
  bool bVar18;
  floatx80 a;
  char str [128];
  byte local_b8 [19];
  byte abStack_a5 [117];
  
  a._4_4_ = 0;
  a._0_4_ = fpr._0_4_;
  a.low = fpr.low;
  fVar4 = floatx80_to_float64(a);
  sprintf((char *)local_b8,"%.16e",fVar4);
  uVar6 = (ulong)(local_b8[0] == 0x2d);
  bVar10 = local_b8[uVar6];
  uVar14 = uVar6 + 1;
  uVar15 = uVar6 + 2;
  if (bVar10 != 0x2b) {
    uVar15 = uVar14;
    uVar14 = uVar6;
  }
  pbVar17 = local_b8 + 2;
  if (bVar10 == 0x2b) {
    pbVar17 = local_b8 + 3;
  }
  bVar11 = local_b8[uVar14];
  bVar1 = local_b8[uVar15];
  pbVar17 = pbVar17 + uVar6;
  if (bVar1 != 0x2e) {
    pbVar17 = local_b8 + uVar15;
  }
  uVar12 = k;
  if (k + 0xdU < 0xe) {
    uVar14 = (ulong)(local_b8[0] == 0x2d);
    lVar16 = uVar14 + 0x13;
    pbVar7 = abStack_a5 + uVar14 + 1;
    if (bVar10 == 0x2b) {
      lVar16 = uVar14 + 0x14;
      pbVar7 = abStack_a5 + uVar6 + 2;
    }
    pbVar13 = local_b8 + lVar16;
    if (bVar1 == 0x2e) {
      pbVar13 = pbVar7;
    }
    lVar16 = 0;
    uVar12 = 0;
    do {
      uVar8 = (int)(char)pbVar13[lVar16] - 0x30U | uVar12 << 4;
      if (9 < (byte)(pbVar13[lVar16] - 0x30)) {
        uVar8 = uVar12;
      }
      uVar12 = uVar8;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 3);
    uVar6 = (ulong)(local_b8[0] == 0x2d);
    uVar14 = uVar6 + 0x13;
    uVar15 = uVar6 | 0x12;
    if (bVar10 == 0x2b) {
      uVar15 = uVar14;
      uVar14 = uVar6 + 0x14;
    }
    if (bVar1 == 0x2e) {
      uVar15 = uVar14;
    }
    uVar8 = -uVar12;
    if (local_b8[uVar15] != 0x2d) {
      uVar8 = uVar12;
    }
    iVar5 = uVar8 - k;
    if ('4' < (char)pbVar17[iVar5]) {
      pbVar17[(int)(~k + uVar8)] = pbVar17[(int)(~k + uVar8)] + 1;
    }
    uVar12 = 0;
    if (iVar5 < 0x10) {
      memset(pbVar17 + iVar5,0x30,(ulong)((k - uVar8) + 0xf) + 1);
    }
  }
  uVar8 = (int)(char)bVar11 - 0x30U | (uint)(local_b8[0] == 0x2d) << 0x1f;
  iVar5 = 8;
  value = 0;
  do {
    bVar10 = *pbVar17 - 0x30;
    bVar18 = bVar10 < 10;
    if (!bVar18) {
      bVar10 = 0;
    }
    pbVar17 = pbVar17 + bVar18;
    value = (int)(char)bVar10 | value << 4;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  iVar5 = 8;
  value_00 = 0;
  do {
    bVar11 = *pbVar17 - 0x30;
    bVar10 = bVar11;
    if (bVar11 >= 10) {
      bVar10 = 0;
    }
    pbVar17 = pbVar17 + (bVar11 < 10);
    value_00 = (int)(char)bVar10 | value_00 << 4;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  if (uVar12 - 1 < 0x11) {
    value = value & pkmask2[uVar12];
    value_00 = value_00 & pkmask3[uVar12];
  }
  if ((*pbVar17 | 0x20) == 0x65) {
    bVar18 = pbVar17[1] == 0x2d;
    pbVar7 = pbVar17 + 1;
    if (bVar18) {
      pbVar7 = pbVar17 + 2;
    }
    pbVar13 = pbVar17 + (ulong)bVar18 + 2;
    if (pbVar17[(ulong)bVar18 + 1] != 0x2b) {
      pbVar13 = pbVar7;
    }
    uVar12 = 0;
    iVar5 = 3;
    do {
      bVar10 = *pbVar13;
      bVar11 = bVar10 - 0x30;
      pbVar13 = pbVar13 + (bVar11 < 10);
      uVar2 = (int)(char)bVar10 - 0x30U | uVar12 << 4;
      if (9 < bVar11) {
        uVar2 = uVar12;
      }
      uVar12 = uVar2;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    if (pbVar17[1] == 0x2d) {
      uVar8 = uVar8 | 0x40000000;
    }
    uVar8 = uVar12 << 0x10 | uVar8;
  }
  my_fc_handler(m68ki_cpu.s_flag | 1);
  uVar3 = ea;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar3 = pmmu_translate_addr(ea);
  }
  m68k_write_memory_32(uVar3 & m68ki_cpu.address_mask,uVar8);
  uVar9 = ea + 4;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar9 = pmmu_translate_addr(uVar9);
  }
  m68k_write_memory_32(uVar9 & m68ki_cpu.address_mask,value);
  uVar9 = ea + 8;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar9 = pmmu_translate_addr(uVar9);
  }
  m68k_write_memory_32(uVar9 & m68ki_cpu.address_mask,value_00);
  return;
}

Assistant:

static inline void store_pack_float80(uint32 ea, int k, floatx80 fpr)
{
	uint32 dw1, dw2, dw3;
	char str[128], *ch;
	int i, j, exp;

	dw1 = dw2 = dw3 = 0;
	ch = &str[0];

	sprintf(str, "%.16e", fx80_to_double(fpr));

	if (*ch == '-')
	{
		ch++;
		dw1 = 0x80000000;
	}

	if (*ch == '+')
	{
		ch++;
	}

	dw1 |= (*ch++ - '0');

	if (*ch == '.')
	{
		ch++;
	}

	// handle negative k-factor here
	if ((k <= 0) && (k >= -13))
	{
		exp = 0;
		for (i = 0; i < 3; i++)
		{
			if (ch[18+i] >= '0' && ch[18+i] <= '9')
			{
				exp = (exp << 4) | (ch[18+i] - '0');
			}
		}

		if (ch[17] == '-')
		{
			exp = -exp;
		}

		k = -k;
		// last digit is (k + exponent - 1)
		k += (exp - 1);

		// round up the last significant mantissa digit
		if (ch[k+1] >= '5')
		{
			ch[k]++;
		}

		// zero out the rest of the mantissa digits
		for (j = (k+1); j < 16; j++)
		{
			ch[j] = '0';
		}

		// now zero out K to avoid tripping the positive K detection below
		k = 0;
	}

	// crack 8 digits of the mantissa
	for (i = 0; i < 8; i++)
	{
		dw2 <<= 4;
		if (*ch >= '0' && *ch <= '9')
		{
			dw2 |= *ch++ - '0';
		}
	}

	// next 8 digits of the mantissa
	for (i = 0; i < 8; i++)
	{
		dw3 <<= 4;
		if (*ch >= '0' && *ch <= '9')
		dw3 |= *ch++ - '0';
	}

	// handle masking if k is positive
	if (k >= 1)
	{
		if (k <= 17)
		{
			dw2 &= pkmask2[k];
			dw3 &= pkmask3[k];
		}
		else
		{
			dw2 &= pkmask2[17];
			dw3 &= pkmask3[17];
//			m68ki_cpu.fpcr |=  (need to set OPERR bit)
		}
	}

	// finally, crack the exponent
	if (*ch == 'e' || *ch == 'E')
	{
		ch++;
		if (*ch == '-')
		{
			ch++;
			dw1 |= 0x40000000;
		}

		if (*ch == '+')
		{
			ch++;
		}

		j = 0;
		for (i = 0; i < 3; i++)
		{
			if (*ch >= '0' && *ch <= '9')
			{
				j = (j << 4) | (*ch++ - '0');
			}
		}

		dw1 |= (j << 16);
	}

	m68ki_write_32(ea, dw1);
	m68ki_write_32(ea+4, dw2);
	m68ki_write_32(ea+8, dw3);
}